

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 05_algorithm.cc
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  result_type *__a;
  int iVar2;
  long *plVar3;
  undefined1 *puVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  long lVar6;
  pointer pbVar7;
  pointer pbVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  anon_class_1_0_00000001 quote;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  long_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  anon_class_1_0_00000001 local_141;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [2];
  result_type local_88;
  result_type *local_68;
  undefined8 local_60;
  iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_examples_tutorial_05_algorithm_cc:21:16)_&>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"bb","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"looong","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"looooong","");
  plVar3 = local_98;
  local_a8[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"with, comma, and, space","");
  __a = &local_88;
  __l._M_len = 5;
  __l._M_array = &local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)__a);
  lVar6 = -0xa0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  get_words_longer_than(&local_140,&local_48,3);
  ezy::
  join<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3]>
            (&local_128,(ezy *)&local_140,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",(char (*) [3])__a);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_128._M_dataplus._M_p,local_128._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if (local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
  }
  else {
    local_128._M_dataplus._M_p =
         (pointer)local_140.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_128._M_string_length = (size_type)&local_141;
    ezy::detail::
    iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/tutorial/05_algorithm.cc:21:16)_&>
    ::operator*(&local_88,
                (iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_examples_tutorial_05_algorithm_cc:21:16)_&>
                 *)&local_128);
    pbVar8 = local_140.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    _Var5._M_current =
         local_140.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    local_60 = 0x202c;
    local_68 = &local_88;
    local_58.
    super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .orig._M_current =
         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )_Var5._M_current;
    local_58.converter = &local_141;
    if (_Var5._M_current !=
        local_140.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_58.
        super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .orig._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var5._M_current;
        ezy::detail::
        iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/examples/tutorial/05_algorithm.cc:21:16)_&>
        ::operator*(&local_128,&local_58);
        std::__cxx11::string::append((char *)local_68);
        std::__cxx11::string::_M_append((char *)local_68,(ulong)local_128._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        _Var5._M_current = _Var5._M_current + 1;
        local_58.
        super_basic_iterator_adaptor<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .orig._M_current =
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var5._M_current;
      } while (_Var5._M_current != pbVar8);
    }
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  pbVar8 = local_140.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar4 = (undefined1 *)0x0;
    pbVar7 = local_140.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&pbVar7->_M_dataplus)->_M_allocated_capacity,
                 pbVar7->_M_string_length +
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&pbVar7->_M_dataplus)->_M_allocated_capacity);
      local_108[0] = puVar4;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,". ",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_128._M_dataplus._M_p,local_128._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (puVar4 == (undefined1 *)0xfffffffffffffffe) break;
      puVar4 = puVar4 + 1;
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 != pbVar8);
  }
  if (local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_140.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar2 = 1;
    pbVar8 = local_140.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&pbVar8->_M_dataplus)->_M_allocated_capacity,
                 pbVar8->_M_string_length +
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&pbVar8->_M_dataplus)->_M_allocated_capacity);
      local_108[0] = (undefined1 *)CONCAT44(local_108[0]._4_4_,iVar2);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,". ",2);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,local_128._M_dataplus._M_p,local_128._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if (iVar2 == 0x7ffffffe) break;
      iVar2 = iVar2 + 1;
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_140.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return 4;
}

Assistant:

int main()
{
  const std::vector<std::string> words{"a", "bb", "looong", "looooong", "with, comma, and, space"};
  const auto long_words = get_words_longer_than(words, 3);
  std::cout << ezy::join(long_words, ", ") << "\n";

  auto quote = [](const std::string &s) { return std::string() + "\"" + s + "\""; };
  std::cout << ezy::join(ezy::transform(long_words, quote), ", ") << "\n";

  //
  const auto print_with_number = [](const auto& element)
  {
    const auto& [i, word] = element;
    std::cout << i << ". " << word << "\n";
  };

  ezy::for_each(ezy::enumerate(long_words), print_with_number);

  ezy::for_each(ezy::zip(ezy::iterate(1), long_words), print_with_number);
  return 4;
}